

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void use_skill(int skill,int degree)

{
  boolean bVar1;
  int iVar2;
  boolean advance_before;
  int degree_local;
  int skill_local;
  
  if ((skill != 0) && (u.weapon_skills[skill].skill != '\0')) {
    bVar1 = can_advance(skill,'\0');
    iVar2 = skill_crosstrain_bonus(skill);
    u.weapon_skills[skill].advance = u.weapon_skills[skill].advance + (short)degree * (short)iVar2;
    if ((bVar1 == '\0') && (bVar1 = can_advance(skill,'\0'), bVar1 != '\0')) {
      give_may_advance_msg(skill);
    }
  }
  return;
}

Assistant:

void use_skill(int skill, int degree)
{
    boolean advance_before;

    if (skill != P_NONE && !P_RESTRICTED(skill)) {
	advance_before = can_advance(skill, FALSE);
	P_ADVANCE(skill) += degree * skill_crosstrain_bonus(skill);
	if (!advance_before && can_advance(skill, FALSE))
	    give_may_advance_msg(skill);
    }
}